

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::publish
          (Publication *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *val)

{
  string_view val_00;
  bool bVar1;
  SmallBuffer *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  bool doPublish;
  basic_string_view<char,_std::char_traits<char>_> str;
  SmallBuffer buffer;
  SmallBuffer *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  data_view *this_00;
  Publication *pub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_e9 [33];
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  byte local_ad;
  undefined1 local_a0 [48];
  data_view local_70 [3];
  
  this_00 = local_70;
  ValueConverter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::convert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  pub = (Publication *)local_a0;
  data_view::data_view(this_00,in_RDI);
  bVar2 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                    ((data_view *)in_stack_fffffffffffffeb0);
  local_a0._32_16_ = (undefined1  [16])bVar2;
  data_view::~data_view((data_view *)0x2c36f2);
  local_ad = *(long *)((in_RDI->buffer)._M_elems + 0x38) != 0;
  if ((in_RDI->userKey & 1) != 0) {
    val_00._M_str = (char *)pub;
    val_00._M_len = (size_t)this_00;
    local_c8 = (basic_string_view<char,_std::char_traits<char>_>)local_a0._32_16_;
    bVar1 = changeDetected((defV *)in_RDI,val_00,
                           (double)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffef0,
                 (basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_len,
                 (allocator<char> *)bVar2._M_str);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffeb0);
      std::allocator<char>::~allocator(local_e9);
    }
    else {
      local_ad = 0;
    }
  }
  if ((local_ad & 1) != 0) {
    in_stack_fffffffffffffeb0 = (SmallBuffer *)&stack0xfffffffffffffef0;
    data_view::data_view(this_00,in_RDI);
    helics::ValueFederate::publishBytes((ValueFederate *)bVar2._M_str,pub,this_00);
    data_view::~data_view((data_view *)0x2c3866);
  }
  SmallBuffer::~SmallBuffer(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void Publication::publish(const std::vector<std::string>& val)
{
    auto buffer = ValueConverter<std::vector<std::string>>::convert(val);
    auto str = ValueConverter<std::string_view>::interpret(buffer);
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, str, delta)) {
            prevValue = std::string(str);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        fed->publishBytes(*this, buffer);
    }
}